

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcSystemFurnitureElementType::~IfcSystemFurnitureElementType
          (IfcSystemFurnitureElementType *this)

{
  undefined1 *puVar1;
  
  *(undefined8 *)
   &this[-1].super_IfcFurnishingElementType.super_IfcElementType.super_IfcTypeProduct.
    super_IfcTypeObject.field_0x28 = 0x8e83f0;
  *(undefined8 *)
   &(this->super_IfcFurnishingElementType).super_IfcElementType.super_IfcTypeProduct.
    super_IfcTypeObject.field_0x10 = 0x8e84b8;
  *(undefined8 *)
   &this[-1].super_IfcFurnishingElementType.super_IfcElementType.super_IfcTypeProduct.
    super_IfcTypeObject.super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcTypeObject,_2UL>.field_0x18 =
       0x8e8418;
  *(undefined8 *)
   &this[-1].super_IfcFurnishingElementType.super_IfcElementType.super_IfcTypeProduct.
    super_IfcTypeObject.field_0xc0 = 0x8e8440;
  *(undefined8 *)
   &this[-1].super_IfcFurnishingElementType.super_IfcElementType.super_IfcTypeProduct.field_0x118 =
       0x8e8468;
  *(undefined8 *)&this[-1].super_IfcFurnishingElementType.super_IfcElementType.field_0x170 =
       0x8e8490;
  puVar1 = *(undefined1 **)&this[-1].super_IfcFurnishingElementType.super_IfcElementType.field_0x180
  ;
  if (puVar1 != &this[-1].super_IfcFurnishingElementType.super_IfcElementType.field_0x190) {
    operator_delete(puVar1);
  }
  IfcTypeProduct::~IfcTypeProduct
            ((IfcTypeProduct *)
             &this[-1].super_IfcFurnishingElementType.super_IfcElementType.super_IfcTypeProduct.
              super_IfcTypeObject.field_0x28,&PTR_construction_vtable_24__008e8150);
  return;
}

Assistant:

IfcSystemFurnitureElementType() : Object("IfcSystemFurnitureElementType") {}